

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O2

bool duckdb::AlpAnalyze<float>(AnalyzeState *state,Vector *input,idx_t count)

{
  value_type vVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  idx_t i;
  size_type sVar7;
  idx_t i_2;
  ulong uVar8;
  size_type nulls_count;
  ulong __n;
  AlpSamplingParameters AVar9;
  allocator_type local_cd;
  value_type_conflict5 local_cc;
  vector<float,_true> current_vector_values;
  vector<float,_true> current_vector_sample;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  
  pp_Var2 = state[3]._vptr_AnalyzeState;
  if ((ulong)pp_Var2 % 7 == 0) {
    pp_Var3 = state[2]._vptr_AnalyzeState;
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var2 + 1);
    if ((0x1f < count) || (pp_Var3 == (_func_int **)0x0)) {
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      Vector::ToUnifiedFormat(input,count,&vdata);
      AVar9 = alp::AlpUtils::GetSamplingParameters(count);
      __n = AVar9._0_8_ & 0xffffffff;
      current_vector_values.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start.
      _0_2_ = 0;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&current_vector_null_positions.
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,__n,
                 (value_type_conflict6 *)&current_vector_values,
                 (allocator_type *)&current_vector_sample);
      current_vector_sample.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = 0;
      ::std::vector<float,_std::allocator<float>_>::vector
                (&current_vector_values.super_vector<float,_std::allocator<float>_>,__n,
                 (value_type_conflict5 *)&current_vector_sample,(allocator_type *)&local_cc);
      local_cc = 0.0;
      ::std::vector<float,_std::allocator<float>_>::vector
                (&current_vector_sample.super_vector<float,_std::allocator<float>_>,
                 (ulong)AVar9.n_sampled_values,&local_cc,&local_cd);
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
          sVar4 = sVar7;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(vdata.sel)->sel_vector[sVar7];
          }
          vVar1 = *(value_type *)(vdata.data + sVar4 * 4);
          pvVar6 = vector<float,_true>::get<true>(&current_vector_values,sVar7);
          *pvVar6 = vVar1;
        }
      }
      else {
        nulls_count = 0;
        for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
          sVar4 = sVar7;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(vdata.sel)->sel_vector[sVar7];
          }
          if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8 = (ulong)((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                             [sVar4 >> 6] >> (sVar4 & 0x3f) & 1) == 0);
          }
          vVar1 = *(value_type *)(vdata.data + sVar4 * 4);
          pvVar5 = vector<unsigned_short,_true>::get<true>
                             (&current_vector_null_positions,nulls_count);
          *pvVar5 = (value_type)sVar7;
          pvVar6 = vector<float,_true>::get<true>(&current_vector_values,sVar7);
          nulls_count = nulls_count + uVar8;
          *pvVar6 = vVar1;
        }
        alp::AlpUtils::FindAndReplaceNullsInVector<float>
                  ((float *)CONCAT62(current_vector_values.
                                     super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start._2_6_,
                                     current_vector_values.
                                     super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_2_),
                   current_vector_null_positions.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,__n,nulls_count);
      }
      sVar7 = 0;
      for (uVar8 = 0; uVar8 < __n; uVar8 = uVar8 + (AVar9._0_8_ >> 0x20)) {
        pvVar6 = vector<float,_true>::get<true>(&current_vector_values,uVar8);
        vVar1 = *pvVar6;
        pvVar6 = vector<float,_true>::get<true>(&current_vector_sample,sVar7);
        *pvVar6 = vVar1;
        sVar7 = sVar7 + 1;
      }
      ::std::vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>>::
      emplace_back<duckdb::vector<float,true>>
                ((vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>> *)
                 (state + 5),&current_vector_values);
      ::std::vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>>::
      emplace_back<duckdb::vector<float,true>>
                ((vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>> *)
                 &state[3].info,&current_vector_sample);
      state[2]._vptr_AnalyzeState = (_func_int **)((long)state[2]._vptr_AnalyzeState + 1);
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&current_vector_sample);
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&current_vector_values);
      ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &current_vector_null_positions);
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
  }
  else {
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var2 + 1);
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
  }
  return true;
}

Assistant:

bool AlpAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;
	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_values(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the entire sampled vector
	//! We need to store the entire sampled vector to perform the 'analyze' compression in it
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			current_vector_values[i] = value;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(i);
			nulls_idx += is_null;
			current_vector_values[i] = value;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<T>(current_vector_values.data(),
		                                              current_vector_null_positions.data(),
		                                              sampling_params.n_lookup_values, nulls_idx);
	}

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
		current_vector_sample[sample_idx] = current_vector_values[i];
		sample_idx++;
	}
	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	//! A std::move is needed to avoid a copy of the pushed vector
	analyze_state.complete_vectors_sampled.push_back(std::move(current_vector_values));
	analyze_state.rowgroup_sample.push_back(std::move(current_vector_sample));
	analyze_state.vectors_sampled_count++;
	return true;
}